

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3RowSetNext(RowSet *p,i64 *pRowid)

{
  RowSetEntry *pRVar1;
  int iVar2;
  
  if ((p->rsFlags & 2) == 0) {
    if ((p->rsFlags & 1) == 0) {
      pRVar1 = rowSetEntrySort(p->pEntry);
      p->pEntry = pRVar1;
    }
    *(byte *)&p->rsFlags = (byte)p->rsFlags | 3;
  }
  pRVar1 = p->pEntry;
  if (pRVar1 == (RowSetEntry *)0x0) {
    iVar2 = 0;
  }
  else {
    *pRowid = pRVar1->v;
    pRVar1 = pRVar1->pRight;
    p->pEntry = pRVar1;
    iVar2 = 1;
    if (pRVar1 == (RowSetEntry *)0x0) {
      sqlite3RowSetClear(p);
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetNext(RowSet *p, i64 *pRowid){
  assert( p!=0 );
  assert( p->pForest==0 );  /* Cannot be used with sqlite3RowSetText() */

  /* Merge the forest into a single sorted list on first call */
  if( (p->rsFlags & ROWSET_NEXT)==0 ){  /*OPTIMIZATION-IF-FALSE*/
    if( (p->rsFlags & ROWSET_SORTED)==0 ){  /*OPTIMIZATION-IF-FALSE*/
      p->pEntry = rowSetEntrySort(p->pEntry);
    }
    p->rsFlags |= ROWSET_SORTED|ROWSET_NEXT;
  }

  /* Return the next entry on the list */
  if( p->pEntry ){
    *pRowid = p->pEntry->v;
    p->pEntry = p->pEntry->pRight;
    if( p->pEntry==0 ){ /*OPTIMIZATION-IF-TRUE*/
      /* Free memory immediately, rather than waiting on sqlite3_finalize() */
      sqlite3RowSetClear(p);
    }
    return 1;
  }else{
    return 0;
  }
}